

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::ConnectBlock
          (Chainstate *this,CBlock *block,BlockValidationState *state,CBlockIndex *pindex,
          CCoinsViewCache *view,bool fJustCheck)

{
  bool *pbVar1;
  int64_t *piVar2;
  duration *pdVar3;
  pointer *ppCVar4;
  int iVar5;
  long lVar6;
  uint256 *puVar7;
  pointer ptVar8;
  pointer ptVar9;
  CChainParams *consensusParams;
  Notifications *pNVar10;
  ChainstateManager *pCVar11;
  BlockManager *pBVar12;
  pointer psVar13;
  element_type *peVar14;
  CTransaction *this_00;
  pointer pCVar15;
  pointer pCVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uchar *puVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  optional<uint256> *poVar28;
  uchar *puVar29;
  __node_base_ptr p_Var30;
  CBlockIndex *pCVar31;
  optional<arith_uint256> *b;
  int64_t iVar32;
  ulong uVar33;
  Logger *pLVar34;
  pointer psVar35;
  Coin *pCVar36;
  long lVar37;
  long lVar38;
  CAmount CVar39;
  CTxUndo *txundo;
  _Hash_node_base *p_Var40;
  ulong uVar41;
  CCheckQueue<CScriptCheck> *pqueueIn;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks;
  pointer pCVar42;
  int iVar43;
  long lVar44;
  ulong uVar45;
  long in_FS_OFFSET;
  bool bVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  pointer pCVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  uint local_204;
  ulong local_1c8;
  long local_1b8;
  double local_198;
  uint local_18c;
  CAmount txfee;
  pointer pCStack_180;
  pointer local_178;
  vector<int,_std::allocator<int>_> prevheights;
  vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> txsdata;
  CBlockUndo blockundo;
  CBlockIndex *pindex_local;
  CCheckQueueControl<CScriptCheck> control;
  CAmount blockReward;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  CTxUndo undoDummy;
  undefined1 auStack_d0 [8];
  undefined1 local_c8 [48];
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  uint256 block_hash;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pindex_local = pindex;
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x967,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  CBlockHeader::GetHash(&block_hash,&block->super_CBlockHeader);
  puVar7 = pindex_local->phashBlock;
  auVar53[0] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
  auVar53[1] = -(block_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
  auVar53[2] = -(block_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
  auVar53[3] = -(block_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
  auVar53[4] = -(block_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
  auVar53[5] = -(block_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
  auVar53[6] = -(block_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
  auVar53[7] = -(block_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
  auVar53[8] = -(block_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
  auVar53[9] = -(block_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
  auVar53[10] = -(block_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                 (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
  auVar53[0xb] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
  auVar53[0xc] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
  auVar53[0xd] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
  auVar53[0xe] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
  auVar53[0xf] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
  auVar48[0] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x10]);
  auVar48[1] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x11]);
  auVar48[2] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x12]);
  auVar48[3] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x13]);
  auVar48[4] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x14]);
  auVar48[5] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x15]);
  auVar48[6] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x16]);
  auVar48[7] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x17]);
  auVar48[8] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x18]);
  auVar48[9] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                (puVar7->super_base_blob<256U>).m_data._M_elems[0x19]);
  auVar48[10] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 (puVar7->super_base_blob<256U>).m_data._M_elems[0x1a]);
  auVar48[0xb] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0x1b]);
  auVar48[0xc] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0x1c]);
  auVar48[0xd] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0x1d]);
  auVar48[0xe] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0x1e]);
  auVar48[0xf] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  (puVar7->super_base_blob<256U>).m_data._M_elems[0x1f]);
  auVar48 = auVar48 & auVar53;
  if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("*pindex->phashBlock == block_hash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x96a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  ptVar8 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar9 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar27 = std::chrono::_V2::steady_clock::now();
  consensusParams = (this->m_chainman->m_options).chainparams;
  bVar21 = CheckBlock(block,state,&consensusParams->consensus,!fJustCheck,!fJustCheck);
  if (!bVar21) {
    if ((state->super_ValidationState<BlockValidationResult>).m_result == BLOCK_MUTATED) {
      pNVar10 = (this->m_chainman->m_options).notifications;
      ppCVar4 = &undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppCVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&undoDummy,"Corrupt block found indicating potential hardware failure.",
                 "");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,"Corrupt block found indicating potential hardware failure.",
                   "");
      }
      else {
        local_78 = "Corrupt block found indicating potential hardware failure.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_78);
      }
      (*pNVar10->_vptr_Notifications[8])(pNVar10,&undoDummy);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&undoDummy);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)ppCVar4) {
LAB_00aefc36:
        operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (ulong)((long)&((undoDummy.vprevout.
                                         super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage)->out).nValue + 1
                               ));
      }
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)&undoDummy,&state->super_ValidationState<BlockValidationResult>);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ConnectBlock";
      logging_function._M_len = 0xc;
      LogPrintFormatInternal<char[13],std::__cxx11::string>
                (logging_function,source_file,0x984,ALL,Error,(ConstevalFormatString<2U>)0xfd398f,
                 (char (*) [13])"ConnectBlock",(string *)&undoDummy);
      if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_00aefc36;
    }
    bVar24 = 0;
    goto LAB_00af1669;
  }
  if (pindex_local->pprev == (CBlockIndex *)0x0) {
    local_78 = (char *)0x0;
    uStack_70 = 0;
    local_68 = (undefined1  [16])0x0;
  }
  else {
    puVar7 = pindex_local->pprev->phashBlock;
    if (puVar7 == (uint256 *)0x0) goto LAB_00af171c;
    local_78 = *(char **)(puVar7->super_base_blob<256U>).m_data._M_elems;
    uStack_70 = *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 8);
    local_68 = *(undefined1 (*) [16])((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
  }
  (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&undoDummy);
  auVar52[0] = -((char)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage == local_68[0]);
  auVar52[1] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._1_1_ == local_68[1]);
  auVar52[2] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._2_1_ == local_68[2]);
  auVar52[3] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ == local_68[3]);
  auVar52[4] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_1_ == local_68[4]);
  auVar52[5] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._5_1_ == local_68[5]);
  auVar52[6] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._6_1_ == local_68[6]);
  auVar52[7] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._7_1_ == local_68[7]);
  auVar52[8] = -(auStack_d0[0] == local_68[8]);
  auVar52[9] = -(auStack_d0[1] == local_68[9]);
  auVar52[10] = -(auStack_d0[2] == local_68[10]);
  auVar52[0xb] = -(auStack_d0[3] == local_68[0xb]);
  auVar52[0xc] = -(auStack_d0[4] == local_68[0xc]);
  auVar52[0xd] = -(auStack_d0[5] == local_68[0xd]);
  auVar52[0xe] = -(auStack_d0[6] == local_68[0xe]);
  auVar52[0xf] = -(auStack_d0[7] == local_68[0xf]);
  auVar49[0] = -((char)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                       super__Vector_impl_data._M_start == (char)local_78);
  auVar49[1] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._1_1_ == local_78._1_1_);
  auVar49[2] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._2_1_ == local_78._2_1_);
  auVar49[3] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._3_1_ == local_78._3_1_);
  auVar49[4] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._4_1_ == local_78._4_1_);
  auVar49[5] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._5_1_ == local_78._5_1_);
  auVar49[6] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._6_1_ == local_78._6_1_);
  auVar49[7] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_start._7_1_ == local_78._7_1_);
  auVar49[8] = -((char)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                       super__Vector_impl_data._M_finish == (char)uStack_70);
  auVar49[9] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_finish._1_1_ == uStack_70._1_1_);
  auVar49[10] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                  super__Vector_impl_data._M_finish._2_1_ == uStack_70._2_1_);
  auVar49[0xb] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                   super__Vector_impl_data._M_finish._3_1_ == uStack_70._3_1_);
  auVar49[0xc] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_1_ == uStack_70._4_1_);
  auVar49[0xd] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                   super__Vector_impl_data._M_finish._5_1_ == uStack_70._5_1_);
  auVar49[0xe] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                   super__Vector_impl_data._M_finish._6_1_ == uStack_70._6_1_);
  auVar49[0xf] = -(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                   super__Vector_impl_data._M_finish._7_1_ == uStack_70._7_1_);
  auVar49 = auVar49 & auVar52;
  if ((ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("hashPrevBlock == view.GetBestBlock()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x98a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar11 = this->m_chainman;
  piVar2 = &pCVar11->num_blocks_total;
  *piVar2 = *piVar2 + 1;
  auVar54[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0] == block_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar54[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [1] == block_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar54[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [2] == block_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar54[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [3] == block_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar54[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [4] == block_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar54[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [5] == block_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar54[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [6] == block_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar54[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [7] == block_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar54[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [8] == block_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar54[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [9] == block_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar54[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[10] == block_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar54[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xb] == block_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar54[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xc] == block_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar54[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xd] == block_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar54[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xe] == block_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar54[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xf] == block_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar50[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x10] == block_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar50[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x11] == block_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar50[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x12] == block_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar50[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x13] == block_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar50[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x14] == block_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar50[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x15] == block_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar50[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x16] == block_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar50[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x17] == block_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar50[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x18] == block_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar50[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x19] == block_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar50[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[0x1a] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar50[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1b] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar50[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1c] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar50[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1d] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar50[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1e] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar50[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1f] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar50 = auVar50 & auVar54;
  if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar50[0xf] >> 7) << 0xf) == 0xffff) {
    bVar24 = 1;
    if (!fJustCheck) {
      puVar7 = pindex_local->phashBlock;
      if (puVar7 != (uint256 *)0x0) {
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._0_16_ =
             *(undefined1 (*) [16])(puVar7->super_base_blob<256U>).m_data._M_elems;
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
        auStack_d0 = *(undefined1 (*) [8])((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
        CCoinsViewCache::SetBestBlock(view,(uint256 *)&undoDummy);
        goto LAB_00af1669;
      }
      goto LAB_00af171c;
    }
    goto LAB_00af1669;
  }
  poVar28 = inline_assertion_check<true,std::optional<uint256>const&>
                      (&(pCVar11->m_options).assumed_valid_block,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                       ,0x3d4,"AssumedValidBlock","m_options.assumed_valid_block");
  pbVar1 = &(poVar28->super__Optional_base<uint256,_true,_true>)._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
  puVar29 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (poVar28,pbVar1);
  bVar21 = true;
  if ((bool *)puVar29 != pbVar1) {
    pBVar12 = this->m_blockman;
    poVar28 = inline_assertion_check<true,std::optional<uint256>const&>
                        (&(this->m_chainman->m_options).assumed_valid_block,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                         ,0x3d4,"AssumedValidBlock","m_options.assumed_valid_block");
    uVar33 = *(ulong *)&(poVar28->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload;
    p_Var40 = (_Hash_node_base *)0x0;
    p_Var30 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_before_node
                        (&(pBVar12->m_block_index)._M_h,
                         uVar33 % (pBVar12->m_block_index)._M_h._M_bucket_count,(key_type *)poVar28,
                         uVar33);
    if (p_Var30 != (__node_base_ptr)0x0) {
      p_Var40 = p_Var30->_M_nxt;
    }
    if (((p_Var40 != (_Hash_node_base *)0x0) &&
        (pCVar31 = CBlockIndex::GetAncestor((CBlockIndex *)(p_Var40 + 5),pindex_local->nHeight),
        pCVar31 == pindex_local)) &&
       (pCVar31 = CBlockIndex::GetAncestor(this->m_chainman->m_best_header,pindex_local->nHeight),
       pCVar31 == pindex_local)) {
      pCVar31 = this->m_chainman->m_best_header;
      b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                    (&(this->m_chainman->m_options).minimum_chain_work,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                     ,0x3d3,"MinimumChainWork","m_options.minimum_chain_work");
      iVar25 = base_uint<256U>::CompareTo
                         (&(pCVar31->nChainWork).super_base_uint<256U>,(base_uint<256U> *)b);
      if (-1 < iVar25) {
        pCVar31 = this->m_chainman->m_best_header;
        iVar32 = GetBlockProofEquivalentTime
                           (pCVar31,pindex_local,pCVar31,&consensusParams->consensus);
        bVar21 = iVar32 < 0x127501;
      }
    }
  }
  uVar33 = std::chrono::_V2::steady_clock::now();
  pdVar3 = &this->m_chainman->time_check;
  pdVar3->__r = pdVar3->__r + (uVar33 - lVar27);
  pLVar34 = LogInstance();
  bVar22 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
  if (bVar22) {
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)(long)(uVar33 - lVar27) / 1000000.0);
    dVar47 = (double)(this->m_chainman->time_check).__r;
    local_98._M_dataplus._M_p = (pointer)(dVar47 / 1000000000.0);
    blockReward = (CAmount)((dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "ConnectBlock";
    logging_function_00._M_len = 0xc;
    LogPrintFormatInternal<double,double,double>
              (logging_function_00,source_file_00,0x9ba,BENCH,Debug,
               (ConstevalFormatString<3U>)0xfd39d3,(double *)&undoDummy,(double *)&local_98,
               (double *)&blockReward);
  }
  bVar22 = IsBIP30Repeat(pindex_local);
  if (pindex_local->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindex->pprev",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x9ff,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar31 = CBlockIndex::GetAncestor(pindex_local->pprev,(consensusParams->consensus).BIP34Height);
  if (bVar22) {
LAB_00aeffe0:
    uVar45 = uVar33;
    if (0x1e44d5 < pindex_local->nHeight) goto LAB_00af0048;
  }
  else {
    if (pCVar31 != (CBlockIndex *)0x0) {
      puVar7 = pCVar31->phashBlock;
      if (puVar7 == (uint256 *)0x0) goto LAB_00af171c;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           *(undefined1 (*) [16])(puVar7->super_base_blob<256U>).m_data._M_elems;
      puVar29 = (puVar7->super_base_blob<256U>).m_data._M_elems + 0x10;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar29;
      puVar20 = (puVar7->super_base_blob<256U>).m_data._M_elems + 0x18;
      auStack_d0 = *(undefined1 (*) [8])puVar20;
      auVar57[0] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x10] == *puVar29);
      auVar57[1] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x11] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x11]);
      auVar57[2] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x12] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x12]);
      auVar57[3] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x13] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x13]);
      auVar57[4] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x14] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x14]);
      auVar57[5] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x15] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x15]);
      auVar57[6] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x16] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x16]);
      auVar57[7] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x17] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x17]);
      auVar57[8] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x18] == *puVar20);
      auVar57[9] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x19] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x19]);
      auVar57[10] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                      [0x1a] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1a]);
      auVar57[0xb] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1b] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1b]);
      auVar57[0xc] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1c] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1c]);
      auVar57[0xd] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1d] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1d]);
      auVar57[0xe] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1e] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1e]);
      auVar57[0xf] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1f] == (puVar7->super_base_blob<256U>).m_data._M_elems[0x1f]);
      auVar55[0] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[0]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar55[1] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[1]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
      auVar55[2] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[2]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
      auVar55[3] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[3]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
      auVar55[4] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[4]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
      auVar55[5] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[5]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
      auVar55[6] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[6]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
      auVar55[7] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[7]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
      auVar55[8] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[8]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
      auVar55[9] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[9]
                    == (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
      auVar55[10] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                      [10] == (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
      auVar55[0xb] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xb] == (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar55[0xc] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xc] == (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar55[0xd] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xd] == (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar55[0xe] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xe] == (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar55[0xf] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xf] == (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
      auVar55 = auVar55 & auVar57;
      if ((ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar55[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00aeffe0;
    }
LAB_00af0048:
    psVar35 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar22 = psVar35 == psVar13;
    local_204 = (uint)psVar13;
    if (!bVar22) {
      do {
        peVar14 = (psVar35->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        bVar46 = (peVar14->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (peVar14->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (bVar46) {
          peVar14 = (psVar35->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._0_16_ =
               *(undefined1 (*) [16])(peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
          ;
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          auStack_d0 = *(undefined1 (*) [8])
                        ((peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
          iVar25 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                             (view,(string *)&undoDummy);
          if ((char)iVar25 == '\0') {
            uVar45 = 1;
            do {
              peVar14 = (psVar35->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              bVar46 = uVar45 < (ulong)(((long)(peVar14->vout).
                                               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(peVar14->vout).
                                               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                               _M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x3333333333333333);
              if (!bVar46) goto LAB_00af021f;
              peVar14 = (psVar35->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
              super__Vector_impl_data._0_16_ =
                   *(undefined1 (*) [16])
                    (peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)
                    ((peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              auStack_d0 = *(undefined1 (*) [8])
                            ((peVar14->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
              ;
              local_c8._0_4_ = (int)uVar45;
              iVar25 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                                 (view,(string *)&undoDummy);
              uVar45 = uVar45 + 1;
            } while ((char)iVar25 == '\0');
          }
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          logging_function_01._M_str = "ConnectBlock";
          logging_function_01._M_len = 0xc;
          LogPrintFormatInternal<>
                    (logging_function_01,source_file_01,0xa0b,ALL,Info,
                     (ConstevalFormatString<0U>)0xfd3a05);
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>((string *)&undoDummy,"bad-txns-BIP30","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          bVar23 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              (string *)&undoDummy,&local_98);
          local_204 = (uint)bVar23;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((undoDummy.vprevout.
                                             super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage)->out).
                                           nValue + 1));
          }
        }
LAB_00af021f:
        if (bVar46) break;
        psVar35 = psVar35 + 1;
        bVar22 = psVar35 == psVar13;
      } while (!bVar22);
    }
    bVar24 = (byte)local_204;
    uVar45 = (ulong)local_204;
    if (!bVar22) goto LAB_00af1669;
  }
  bVar24 = (byte)uVar45;
  iVar5 = pindex_local->nHeight;
  iVar25 = (((this->m_chainman->m_options).chainparams)->consensus).CSVHeight;
  uVar26 = GetBlockScriptFlags(pindex_local,this->m_chainman);
  lVar27 = std::chrono::_V2::steady_clock::now();
  pdVar3 = &this->m_chainman->time_forks;
  pdVar3->__r = pdVar3->__r + (lVar27 - uVar33);
  pLVar34 = LogInstance();
  bVar22 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
  if (bVar22) {
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)(long)(lVar27 - uVar33) / 1000000.0);
    dVar47 = (double)(this->m_chainman->time_forks).__r;
    local_98._M_dataplus._M_p = (pointer)(dVar47 / 1000000000.0);
    blockReward = (CAmount)((dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_02._M_len = 0x5e;
    logging_function_02._M_str = "ConnectBlock";
    logging_function_02._M_len = 0xc;
    LogPrintFormatInternal<double,double,double>
              (logging_function_02,source_file_02,0xa20,BENCH,Debug,
               (ConstevalFormatString<3U>)0xfd3a4b,(double *)&undoDummy,(double *)&local_98,
               (double *)&blockReward);
  }
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pqueueIn = &this->m_chainman->m_script_check_queue;
  if (!bVar21) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  if (ptVar8 == ptVar9) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  CCheckQueueControl<CScriptCheck>::CCheckQueueControl(&control,pqueueIn);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::vector
            (&txsdata,(long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,
             (allocator_type *)&undoDummy);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve
            (&blockundo.vtxundo,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  psVar35 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar46 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == psVar35;
  bVar22 = !bVar46;
  if (bVar46) {
    local_1c8 = 0;
    iVar43 = 0;
  }
  else {
    pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0;
    if (ptVar8 != ptVar9) {
      pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&txfee;
    }
    iVar43 = 0;
    local_1b8 = 0;
    uVar33 = 0;
    local_1c8 = 0;
    do {
      this_00 = psVar35[uVar33].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      pCVar15 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pCVar16 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar46 = CTransaction::IsCoinBase(this_00);
      if (bVar46) {
LAB_00af09e2:
        iVar32 = GetTransactionSigOpCost(this_00,view,uVar26);
        local_1b8 = local_1b8 + iVar32;
        if (local_1b8 < 0x13881) {
          bVar46 = CTransaction::IsCoinBase(this_00);
          if (!bVar46) {
            local_204 = (uint)uVar45;
            _txfee = (undefined1  [16])0x0;
            local_178 = (pointer)0x0;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = auStack_d0;
            undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
            super__Vector_impl_data._0_16_ = auVar19 << 0x40;
            undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            auStack_d0 = (undefined1  [8])((ulong)auStack_d0 & 0xffffffffffffff00);
            local_c8._8_8_ = local_c8 + 0x18;
            local_c8._16_8_ = 0;
            local_c8[0x18] = '\0';
            if ((!bVar21) ||
               (bVar46 = CheckInputScripts(this_00,(TxValidationState *)&undoDummy,view,uVar26,
                                           fJustCheck,fJustCheck,
                                           txsdata.
                                           super__Vector_base<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar33,
                                           &this->m_chainman->m_validation_cache,pvChecks), bVar46))
            {
              bVar46 = true;
              if (control.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
                CCheckQueue<CScriptCheck>::Add
                          (control.pqueue,
                           (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                            *)&txfee);
              }
            }
            else {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,
                         undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (long)&((undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->out).nValue +
                         (long)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
              blockReward = (CAmount)&local_f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&blockReward,local_c8._8_8_,
                         (pointer)(local_c8._16_8_ + local_c8._8_8_));
              ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         &local_98,(string *)&blockReward);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)blockReward != &local_f8) {
                operator_delete((void *)blockReward,local_f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              base_blob<256u>::ToString_abi_cxx11_(&local_98,&this_00->hash);
              ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                        ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>
                        );
              source_file_07._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_07._M_len = 0x5e;
              logging_function_07._M_str = "ConnectBlock";
              logging_function_07._M_len = 0xc;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_07,source_file_07,0xa6a,ALL,Error,
                         (ConstevalFormatString<2U>)0xfd3b69,&local_98,(string *)&blockReward);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)blockReward != &local_f8) {
                operator_delete((void *)blockReward,local_f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar46 = false;
              local_204 = 0;
            }
            if ((undefined1 *)local_c8._8_8_ != local_c8 + 0x18) {
              operator_delete((void *)local_c8._8_8_,CONCAT71(local_c8._25_7_,local_c8[0x18]) + 1);
            }
            if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)auStack_d0) {
              operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                              _M_impl.super__Vector_impl_data._M_finish,(long)auStack_d0 + 1);
            }
            std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                      ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&txfee);
            if (!bVar46) {
              bVar46 = false;
              uVar45 = (ulong)local_204;
              goto LAB_00af0e81;
            }
            uVar45 = (ulong)local_204;
          }
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          txundo = &undoDummy;
          if ((int)uVar33 != 0) {
            if (blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CTxUndo,_std::allocator<CTxUndo>_>::_M_realloc_insert<>
                        (&blockundo.vtxundo,
                         (iterator)
                         blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            txundo = blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1;
          }
          UpdateCoins(this_00,view,txundo,pindex_local->nHeight);
          std::vector<Coin,_std::allocator<Coin>_>::~vector(&undoDummy.vprevout);
          bVar46 = true;
        }
        else {
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_06._M_len = 0x5e;
          logging_function_06._M_str = "ConnectBlock";
          logging_function_06._M_len = 0xc;
          LogPrintFormatInternal<>
                    (logging_function_06,source_file_06,0xa5c,ALL,Info,
                     (ConstevalFormatString<0U>)0xfd3b41);
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>((string *)&undoDummy,"bad-blk-sigops","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          bVar46 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              (string *)&undoDummy,&local_98);
          uVar45 = (ulong)bVar46;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((undoDummy.vprevout.
                                             super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage)->out).
                                           nValue + 1));
          }
          bVar46 = false;
        }
      }
      else {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = pCStack_180;
        _txfee = auVar17 << 0x40;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auStack_d0;
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._0_16_ = auVar18 << 0x40;
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        auStack_d0 = (undefined1  [8])((ulong)auStack_d0 & 0xffffffffffffff00);
        local_c8._8_8_ = local_c8 + 0x18;
        local_c8._16_8_ = 0;
        local_c8[0x18] = '\0';
        bVar46 = Consensus::CheckTxInputs
                           (this_00,(TxValidationState *)&undoDummy,view,pindex_local->nHeight,
                            &txfee);
        if (bVar46) {
          local_1c8 = local_1c8 + txfee;
          if (local_1c8 < 0x775f05a074001) {
            std::vector<int,_std::allocator<int>_>::resize
                      (&prevheights,
                       ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
            pCVar42 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish != pCVar42) {
              lVar44 = 0;
              uVar41 = 0;
              do {
                pCVar36 = CCoinsViewCache::AccessCoin
                                    (view,(COutPoint *)
                                          ((pCVar42->prevout).hash.m_wrapped.super_base_blob<256U>.
                                           m_data._M_elems + lVar44));
                prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41] = *(uint *)&pCVar36->field_0x28 >> 1;
                uVar41 = uVar41 + 1;
                pCVar42 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar44 = lVar44 + 0x68;
              } while (uVar41 < (ulong)(((long)(this_00->vin).
                                               super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)pCVar42 >> 3) * 0x4ec4ec4ec4ec4ec5));
            }
            bVar23 = SequenceLocks(this_00,(uint)(iVar25 <= iVar5),&prevheights,pindex_local);
            uVar45 = uVar45 & 0xffffffff;
            bVar46 = true;
            if (bVar23) goto LAB_00af098a;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_03._M_len = 0x5e;
            logging_function_03._M_str = "ConnectBlock";
            logging_function_03._M_len = 0xc;
            LogPrintFormatInternal<char[13]>
                      (logging_function_03,source_file_03,0xa51,ALL,Info,
                       (ConstevalFormatString<1U>)0xfd3afc,(char (*) [13])"ConnectBlock");
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"bad-txns-nonfinal","");
            blockReward = (CAmount)&local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&blockReward,"");
            bVar46 = ValidationState<BlockValidationResult>::Invalid
                               (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS
                                ,&local_98,(string *)&blockReward);
          }
          else {
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_05._M_len = 0x5e;
            logging_function_05._M_str = "ConnectBlock";
            logging_function_05._M_len = 0xc;
            LogPrintFormatInternal<char[13]>
                      (logging_function_05,source_file_05,0xa44,ALL,Info,
                       (ConstevalFormatString<1U>)0xfd3aa1,(char (*) [13])"ConnectBlock");
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"bad-txns-accumulated-fee-outofrange","");
            blockReward = (CAmount)&local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&blockReward,"");
            bVar46 = ValidationState<BlockValidationResult>::Invalid
                               (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS
                                ,&local_98,(string *)&blockReward);
          }
          uVar45 = (ulong)bVar46;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockReward != &local_f8) {
            operator_delete((void *)blockReward,local_f8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar46 = false;
        }
        else {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,
                     undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (long)&((undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->out).nValue +
                     (long)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
          blockReward = (CAmount)&local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&blockReward,local_c8._8_8_,
                     (pointer)(local_c8._16_8_ + local_c8._8_8_));
          ValidationState<BlockValidationResult>::Invalid
                    (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,&local_98,
                     (string *)&blockReward);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockReward != &local_f8) {
            operator_delete((void *)blockReward,local_f8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_98,&this_00->hash);
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>);
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_04._M_len = 0x5e;
          logging_function_04._M_str = "ConnectBlock";
          logging_function_04._M_len = 0xc;
          LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                    (logging_function_04,source_file_04,0xa3f,ALL,Error,
                     (ConstevalFormatString<3U>)0xfd3a7b,(char (*) [13])"ConnectBlock",&local_98,
                     (string *)&blockReward);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockReward != &local_f8) {
            operator_delete((void *)blockReward,local_f8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar46 = false;
          uVar45 = 0;
        }
LAB_00af098a:
        if ((undefined1 *)local_c8._8_8_ != local_c8 + 0x18) {
          operator_delete((void *)local_c8._8_8_,CONCAT71(local_c8._25_7_,local_c8[0x18]) + 1);
        }
        if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)auStack_d0) {
          operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl
                          .super__Vector_impl_data._M_finish,(long)auStack_d0 + 1);
        }
        if (bVar46) goto LAB_00af09e2;
        bVar46 = false;
      }
LAB_00af0e81:
      bVar24 = (byte)uVar45;
      iVar43 = iVar43 + (int)((ulong)((long)pCVar15 - (long)pCVar16) >> 3) * -0x3b13b13b;
      if (!bVar46) break;
      uVar33 = (ulong)((int)uVar33 + 1);
      psVar35 = (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar41 = (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar35 >> 4;
      bVar22 = uVar33 < uVar41;
    } while (uVar33 < uVar41);
  }
  if (!bVar22) {
    lVar44 = std::chrono::_V2::steady_clock::now();
    pdVar3 = &this->m_chainman->time_connect;
    pdVar3->__r = pdVar3->__r + (lVar44 - lVar27);
    pLVar34 = LogInstance();
    bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
    if (bVar21) {
      lVar37 = (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      lVar38 = lVar37 >> 4;
      local_18c = (uint)lVar38;
      pCVar51 = (pointer)((double)(lVar44 - lVar27) / 1000000.0);
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = pCVar51;
      auVar56._8_4_ = (int)(lVar37 >> 0x24);
      auVar56._0_8_ = lVar38;
      auVar56._12_4_ = 0x45300000;
      local_98._M_dataplus._M_p =
           (pointer)((double)pCVar51 /
                    ((auVar56._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,local_18c) - 4503599627370496.0)));
      blockReward = 0;
      if (1 < iVar43) {
        blockReward = (CAmount)((double)pCVar51 / (double)(iVar43 + -1));
      }
      dVar47 = (double)(this->m_chainman->time_connect).__r;
      txfee = (CAmount)(dVar47 / 1000000000.0);
      local_198 = (dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      source_file_08._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_08._M_len = 0x5e;
      logging_function_08._M_str = "ConnectBlock";
      logging_function_08._M_len = 0xc;
      LogPrintFormatInternal<unsigned_int,double,double,double,double,double>
                (logging_function_08,source_file_08,0xa7c,BENCH,Debug,
                 (ConstevalFormatString<6U>)0xfd3ba1,&local_18c,(double *)&undoDummy,
                 (double *)&local_98,(double *)&blockReward,(double *)&txfee,&local_198);
    }
    lVar44 = (long)pindex_local->nHeight /
             (long)(consensusParams->consensus).nSubsidyHalvingInterval;
    uVar33 = 0;
    if ((int)lVar44 < 0x40) {
      uVar33 = 5000000000 >> ((byte)lVar44 & 0x3f);
    }
    blockReward = uVar33 + local_1c8;
    CVar39 = CTransaction::GetValueOut
                       ((((block->vtx).
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (blockReward < CVar39) {
      pCVar51 = (pointer)CTransaction::GetValueOut
                                   ((((block->vtx).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_09._M_len = 0x5e;
      logging_function_09._M_str = "ConnectBlock";
      logging_function_09._M_len = 0xc;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = pCVar51;
      LogPrintFormatInternal<long,long>
                (logging_function_09,source_file_09,0xa80,ALL,Info,
                 (ConstevalFormatString<2U>)0xfd3bf8,(long *)&undoDummy,&blockReward);
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&undoDummy,"bad-cb-amount","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      bVar24 = ValidationState<BlockValidationResult>::Invalid
                         (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                          (string *)&undoDummy,&local_98);
LAB_00af15e9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (ulong)((long)&((undoDummy.vprevout.
                                         super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage)->out).nValue + 1
                               ));
      }
    }
    else {
      if (control.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
        bVar21 = CCheckQueue<CScriptCheck>::Loop(control.pqueue,true);
        control.fDone = true;
        if (!bVar21) {
          source_file_13._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_13._M_len = 0x5e;
          logging_function_13._M_str = "ConnectBlock";
          logging_function_13._M_len = 0xc;
          LogPrintFormatInternal<char[13]>
                    (logging_function_13,source_file_13,0xa85,ALL,Info,
                     (ConstevalFormatString<1U>)0xfd3c4d,(char (*) [13])"ConnectBlock");
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&undoDummy,"block-validation-failed","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          bVar24 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              (string *)&undoDummy,&local_98);
          goto LAB_00af15e9;
        }
      }
      lVar44 = std::chrono::_V2::steady_clock::now();
      pdVar3 = &this->m_chainman->time_verify;
      pdVar3->__r = pdVar3->__r + (lVar44 - lVar27);
      pLVar34 = LogInstance();
      bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
      if (bVar21) {
        local_18c = iVar43 - 1;
        pCVar51 = (pointer)((double)(lVar44 - lVar27) / 1000000.0);
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_start = pCVar51;
        local_98._M_dataplus._M_p = (pointer)0x0;
        if (1 < iVar43) {
          local_98._M_dataplus._M_p = (pointer)((double)pCVar51 / (double)(int)local_18c);
        }
        dVar47 = (double)(this->m_chainman->time_verify).__r;
        txfee = (CAmount)(dVar47 / 1000000000.0);
        local_198 = (dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        source_file_10._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_10._M_len = 0x5e;
        logging_function_10._M_str = "ConnectBlock";
        logging_function_10._M_len = 0xc;
        LogPrintFormatInternal<int,double,double,double,double>
                  (logging_function_10,source_file_10,0xa8e,BENCH,Debug,
                   (ConstevalFormatString<5U>)0xfd3c6b,(int *)&local_18c,(double *)&undoDummy,
                   (double *)&local_98,(double *)&txfee,&local_198);
      }
      bVar24 = 1;
      if (!fJustCheck) {
        bVar21 = ::node::BlockManager::WriteUndoDataForBlock
                           (this->m_blockman,&blockundo,state,pindex_local);
        if (bVar21) {
          lVar27 = std::chrono::_V2::steady_clock::now();
          pdVar3 = &this->m_chainman->time_undo;
          pdVar3->__r = pdVar3->__r + (lVar27 - lVar44);
          pLVar34 = LogInstance();
          bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
          if (bVar21) {
            undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((double)(lVar27 - lVar44) / 1000000.0);
            dVar47 = (double)(this->m_chainman->time_undo).__r;
            local_98._M_dataplus._M_p = (pointer)(dVar47 / 1000000000.0);
            txfee = (CAmount)((dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
            source_file_11._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_11._M_len = 0x5e;
            logging_function_11._M_str = "ConnectBlock";
            logging_function_11._M_len = 0xc;
            LogPrintFormatInternal<double,double,double>
                      (logging_function_11,source_file_11,0xa9c,BENCH,Debug,
                       (ConstevalFormatString<3U>)0xfd3cad,(double *)&undoDummy,(double *)&local_98,
                       (double *)&txfee);
          }
          uVar26 = pindex_local->nStatus;
          if ((uVar26 & 0x60) != 0 || (uVar26 & 7) < 5) {
            if ((uVar26 & 7) < 5 && (uVar26 & 0x60) == 0) {
              pindex_local->nStatus = uVar26 & 0xffffff98 | 5;
            }
            std::
            _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
            ::_M_insert_unique<CBlockIndex*const&>
                      ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                        *)&this->m_blockman->m_dirty_blockindex,&pindex_local);
          }
          puVar7 = pindex_local->phashBlock;
          if (puVar7 == (uint256 *)0x0) {
LAB_00af171c:
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._0_16_ =
               *(undefined1 (*) [16])(puVar7->super_base_blob<256U>).m_data._M_elems;
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
          auStack_d0 = *(undefined1 (*) [8])((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18)
          ;
          CCoinsViewCache::SetBestBlock(view,(uint256 *)&undoDummy);
          lVar44 = std::chrono::_V2::steady_clock::now();
          pdVar3 = &this->m_chainman->time_index;
          pdVar3->__r = pdVar3->__r + (lVar44 - lVar27);
          pLVar34 = LogInstance();
          bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar34,BENCH,Debug);
          if (bVar21) {
            undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((double)(lVar44 - lVar27) / 1000000.0);
            dVar47 = (double)(this->m_chainman->time_index).__r;
            local_98._M_dataplus._M_p = (pointer)(dVar47 / 1000000000.0);
            txfee = (CAmount)((dVar47 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
            source_file_12._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_12._M_len = 0x5e;
            logging_function_12._M_str = "ConnectBlock";
            logging_function_12._M_len = 0xc;
            LogPrintFormatInternal<double,double,double>
                      (logging_function_12,source_file_12,0xaab,BENCH,Debug,
                       (ConstevalFormatString<3U>)0xfd3ce1,(double *)&undoDummy,(double *)&local_98,
                       (double *)&txfee);
          }
        }
        else {
          bVar24 = 0;
        }
      }
    }
  }
  if (prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::~vector
            (&txsdata);
  CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&control);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockundo.vtxundo);
LAB_00af1669:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return (bool)(bVar24 & 1);
}

Assistant:

bool Chainstate::ConnectBlock(const CBlock& block, BlockValidationState& state, CBlockIndex* pindex,
                               CCoinsViewCache& view, bool fJustCheck)
{
    AssertLockHeld(cs_main);
    assert(pindex);

    uint256 block_hash{block.GetHash()};
    assert(*pindex->phashBlock == block_hash);
    const bool parallel_script_checks{m_chainman.GetCheckQueue().HasThreads()};

    const auto time_start{SteadyClock::now()};
    const CChainParams& params{m_chainman.GetParams()};

    // Check it again in case a previous version let a bad block in
    // NOTE: We don't currently (re-)invoke ContextualCheckBlock() or
    // ContextualCheckBlockHeader() here. This means that if we add a new
    // consensus rule that is enforced in one of those two functions, then we
    // may have let in a block that violates the rule prior to updating the
    // software, and we would NOT be enforcing the rule here. Fully solving
    // upgrade from one software version to the next after a consensus rule
    // change is potentially tricky and issue-specific (see NeedsRedownload()
    // for one approach that was used for BIP 141 deployment).
    // Also, currently the rule against blocks more than 2 hours in the future
    // is enforced in ContextualCheckBlockHeader(); we wouldn't want to
    // re-enforce that rule here (at least until we make it impossible for
    // the clock to go backward).
    if (!CheckBlock(block, state, params.GetConsensus(), !fJustCheck, !fJustCheck)) {
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED) {
            // We don't write down blocks to disk if they may have been
            // corrupted, so this should be impossible unless we're having hardware
            // problems.
            return FatalError(m_chainman.GetNotifications(), state, _("Corrupt block found indicating potential hardware failure."));
        }
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }

    // verify that the view's current state corresponds to the previous block
    uint256 hashPrevBlock = pindex->pprev == nullptr ? uint256() : pindex->pprev->GetBlockHash();
    assert(hashPrevBlock == view.GetBestBlock());

    m_chainman.num_blocks_total++;

    // Special case for the genesis block, skipping connection of its transactions
    // (its coinbase is unspendable)
    if (block_hash == params.GetConsensus().hashGenesisBlock) {
        if (!fJustCheck)
            view.SetBestBlock(pindex->GetBlockHash());
        return true;
    }

    bool fScriptChecks = true;
    if (!m_chainman.AssumedValidBlock().IsNull()) {
        // We've been configured with the hash of a block which has been externally verified to have a valid history.
        // A suitable default value is included with the software and updated from time to time.  Because validity
        //  relative to a piece of software is an objective fact these defaults can be easily reviewed.
        // This setting doesn't force the selection of any particular chain but makes validating some faster by
        //  effectively caching the result of part of the verification.
        BlockMap::const_iterator it{m_blockman.m_block_index.find(m_chainman.AssumedValidBlock())};
        if (it != m_blockman.m_block_index.end()) {
            if (it->second.GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->nChainWork >= m_chainman.MinimumChainWork()) {
                // This block is a member of the assumed verified chain and an ancestor of the best header.
                // Script verification is skipped when connecting blocks under the
                // assumevalid block. Assuming the assumevalid block is valid this
                // is safe because block merkle hashes are still computed and checked,
                // Of course, if an assumed valid block is invalid due to false scriptSigs
                // this optimization would allow an invalid chain to be accepted.
                // The equivalent time check discourages hash power from extorting the network via DOS attack
                //  into accepting an invalid block through telling users they must manually set assumevalid.
                //  Requiring a software change or burying the invalid block, regardless of the setting, makes
                //  it hard to hide the implication of the demand.  This also avoids having release candidates
                //  that are hardly doing any signature verification at all in testing without having to
                //  artificially set the default assumed verified block further back.
                // The test against the minimum chain work prevents the skipping when denied access to any chain at
                //  least as good as the expected chain.
                fScriptChecks = (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, params.GetConsensus()) <= 60 * 60 * 24 * 7 * 2);
            }
        }
    }

    const auto time_1{SteadyClock::now()};
    m_chainman.time_check += time_1 - time_start;
    LogDebug(BCLog::BENCH, "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_1 - time_start),
             Ticks<SecondsDouble>(m_chainman.time_check),
             Ticks<MillisecondsDouble>(m_chainman.time_check) / m_chainman.num_blocks_total);

    // Do not allow blocks that contain transactions which 'overwrite' older transactions,
    // unless those are already completely spent.
    // If such overwrites are allowed, coinbases and transactions depending upon those
    // can be duplicated to remove the ability to spend the first instance -- even after
    // being sent to another address.
    // See BIP30, CVE-2012-1909, and http://r6.ca/blog/20120206T005236Z.html for more information.
    // This rule was originally applied to all blocks with a timestamp after March 15, 2012, 0:00 UTC.
    // Now that the whole chain is irreversibly beyond that time it is applied to all blocks except the
    // two in the chain that violate it. This prevents exploiting the issue against nodes during their
    // initial block download.
    bool fEnforceBIP30 = !IsBIP30Repeat(*pindex);

    // Once BIP34 activated it was not possible to create new duplicate coinbases and thus other than starting
    // with the 2 existing duplicate coinbase pairs, not possible to create overwriting txs.  But by the
    // time BIP34 activated, in each of the existing pairs the duplicate coinbase had overwritten the first
    // before the first had been spent.  Since those coinbases are sufficiently buried it's no longer possible to create further
    // duplicate transactions descending from the known pairs either.
    // If we're on the known chain at height greater than where BIP34 activated, we can save the db accesses needed for the BIP30 check.

    // BIP34 requires that a block at height X (block X) has its coinbase
    // scriptSig start with a CScriptNum of X (indicated height X).  The above
    // logic of no longer requiring BIP30 once BIP34 activates is flawed in the
    // case that there is a block X before the BIP34 height of 227,931 which has
    // an indicated height Y where Y is greater than X.  The coinbase for block
    // X would also be a valid coinbase for block Y, which could be a BIP30
    // violation.  An exhaustive search of all mainnet coinbases before the
    // BIP34 height which have an indicated height greater than the block height
    // reveals many occurrences. The 3 lowest indicated heights found are
    // 209,921, 490,897, and 1,983,702 and thus coinbases for blocks at these 3
    // heights would be the first opportunity for BIP30 to be violated.

    // The search reveals a great many blocks which have an indicated height
    // greater than 1,983,702, so we simply remove the optimization to skip
    // BIP30 checking for blocks at height 1,983,702 or higher.  Before we reach
    // that block in another 25 years or so, we should take advantage of a
    // future consensus change to do a new and improved version of BIP34 that
    // will actually prevent ever creating any duplicate coinbases in the
    // future.
    static constexpr int BIP34_IMPLIES_BIP30_LIMIT = 1983702;

    // There is no potential to create a duplicate coinbase at block 209,921
    // because this is still before the BIP34 height and so explicit BIP30
    // checking is still active.

    // The final case is block 176,684 which has an indicated height of
    // 490,897. Unfortunately, this issue was not discovered until about 2 weeks
    // before block 490,897 so there was not much opportunity to address this
    // case other than to carefully analyze it and determine it would not be a
    // problem. Block 490,897 was, in fact, mined with a different coinbase than
    // block 176,684, but it is important to note that even if it hadn't been or
    // is remined on an alternate fork with a duplicate coinbase, we would still
    // not run into a BIP30 violation.  This is because the coinbase for 176,684
    // is spent in block 185,956 in transaction
    // d4f7fbbf92f4a3014a230b2dc70b8058d02eb36ac06b4a0736d9d60eaa9e8781.  This
    // spending transaction can't be duplicated because it also spends coinbase
    // 0328dd85c331237f18e781d692c92de57649529bd5edf1d01036daea32ffde29.  This
    // coinbase has an indicated height of over 4.2 billion, and wouldn't be
    // duplicatable until that height, and it's currently impossible to create a
    // chain that long. Nevertheless we may wish to consider a future soft fork
    // which retroactively prevents block 490,897 from creating a duplicate
    // coinbase. The two historical BIP30 violations often provide a confusing
    // edge case when manipulating the UTXO and it would be simpler not to have
    // another edge case to deal with.

    // testnet3 has no blocks before the BIP34 height with indicated heights
    // post BIP34 before approximately height 486,000,000. After block
    // 1,983,702 testnet3 starts doing unnecessary BIP30 checking again.
    assert(pindex->pprev);
    CBlockIndex* pindexBIP34height = pindex->pprev->GetAncestor(params.GetConsensus().BIP34Height);
    //Only continue to enforce if we're below BIP34 activation height or the block hash at that height doesn't correspond.
    fEnforceBIP30 = fEnforceBIP30 && (!pindexBIP34height || !(pindexBIP34height->GetBlockHash() == params.GetConsensus().BIP34Hash));

    // TODO: Remove BIP30 checking from block height 1,983,702 on, once we have a
    // consensus change that ensures coinbases at those heights cannot
    // duplicate earlier coinbases.
    if (fEnforceBIP30 || pindex->nHeight >= BIP34_IMPLIES_BIP30_LIMIT) {
        for (const auto& tx : block.vtx) {
            for (size_t o = 0; o < tx->vout.size(); o++) {
                if (view.HaveCoin(COutPoint(tx->GetHash(), o))) {
                    LogPrintf("ERROR: ConnectBlock(): tried to overwrite transaction\n");
                    return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-BIP30");
                }
            }
        }
    }

    // Enforce BIP68 (sequence locks)
    int nLockTimeFlags = 0;
    if (DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_CSV)) {
        nLockTimeFlags |= LOCKTIME_VERIFY_SEQUENCE;
    }

    // Get the script flags for this block
    unsigned int flags{GetBlockScriptFlags(*pindex, m_chainman)};

    const auto time_2{SteadyClock::now()};
    m_chainman.time_forks += time_2 - time_1;
    LogDebug(BCLog::BENCH, "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_forks),
             Ticks<MillisecondsDouble>(m_chainman.time_forks) / m_chainman.num_blocks_total);

    CBlockUndo blockundo;

    // Precomputed transaction data pointers must not be invalidated
    // until after `control` has run the script checks (potentially
    // in multiple threads). Preallocate the vector size so a new allocation
    // doesn't invalidate pointers into the vector, and keep txsdata in scope
    // for as long as `control`.
    CCheckQueueControl<CScriptCheck> control(fScriptChecks && parallel_script_checks ? &m_chainman.GetCheckQueue() : nullptr);
    std::vector<PrecomputedTransactionData> txsdata(block.vtx.size());

    std::vector<int> prevheights;
    CAmount nFees = 0;
    int nInputs = 0;
    int64_t nSigOpsCost = 0;
    blockundo.vtxundo.reserve(block.vtx.size() - 1);
    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const CTransaction &tx = *(block.vtx[i]);

        nInputs += tx.vin.size();

        if (!tx.IsCoinBase())
        {
            CAmount txfee = 0;
            TxValidationState tx_state;
            if (!Consensus::CheckTxInputs(tx, tx_state, view, pindex->nHeight, txfee)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                            tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("%s: Consensus::CheckTxInputs: %s, %s\n", __func__, tx.GetHash().ToString(), state.ToString());
                return false;
            }
            nFees += txfee;
            if (!MoneyRange(nFees)) {
                LogPrintf("ERROR: %s: accumulated fee in the block out of range.\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-accumulated-fee-outofrange");
            }

            // Check that transaction is BIP68 final
            // BIP68 lock checks (as opposed to nLockTime checks) must
            // be in ConnectBlock because they require the UTXO set
            prevheights.resize(tx.vin.size());
            for (size_t j = 0; j < tx.vin.size(); j++) {
                prevheights[j] = view.AccessCoin(tx.vin[j].prevout).nHeight;
            }

            if (!SequenceLocks(tx, nLockTimeFlags, prevheights, *pindex)) {
                LogPrintf("ERROR: %s: contains a non-BIP68-final transaction\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal");
            }
        }

        // GetTransactionSigOpCost counts 3 types of sigops:
        // * legacy (always)
        // * p2sh (when P2SH enabled in flags and excludes coinbase)
        // * witness (when witness enabled in flags and excludes coinbase)
        nSigOpsCost += GetTransactionSigOpCost(tx, view, flags);
        if (nSigOpsCost > MAX_BLOCK_SIGOPS_COST) {
            LogPrintf("ERROR: ConnectBlock(): too many sigops\n");
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops");
        }

        if (!tx.IsCoinBase())
        {
            std::vector<CScriptCheck> vChecks;
            bool fCacheResults = fJustCheck; /* Don't cache results if we're actually connecting blocks (still consult the cache, though) */
            TxValidationState tx_state;
            if (fScriptChecks && !CheckInputScripts(tx, tx_state, view, flags, fCacheResults, fCacheResults, txsdata[i], m_chainman.m_validation_cache, parallel_script_checks ? &vChecks : nullptr)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                              tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("ConnectBlock(): CheckInputScripts on %s failed with %s\n",
                    tx.GetHash().ToString(), state.ToString());
                return false;
            }
            control.Add(std::move(vChecks));
        }

        CTxUndo undoDummy;
        if (i > 0) {
            blockundo.vtxundo.emplace_back();
        }
        UpdateCoins(tx, view, i == 0 ? undoDummy : blockundo.vtxundo.back(), pindex->nHeight);
    }
    const auto time_3{SteadyClock::now()};
    m_chainman.time_connect += time_3 - time_2;
    LogDebug(BCLog::BENCH, "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n", (unsigned)block.vtx.size(),
             Ticks<MillisecondsDouble>(time_3 - time_2), Ticks<MillisecondsDouble>(time_3 - time_2) / block.vtx.size(),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_3 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_connect) / m_chainman.num_blocks_total);

    CAmount blockReward = nFees + GetBlockSubsidy(pindex->nHeight, params.GetConsensus());
    if (block.vtx[0]->GetValueOut() > blockReward) {
        LogPrintf("ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n", block.vtx[0]->GetValueOut(), blockReward);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-amount");
    }

    if (!control.Wait()) {
        LogPrintf("ERROR: %s: CheckQueue failed\n", __func__);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "block-validation-failed");
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_verify += time_4 - time_2;
    LogDebug(BCLog::BENCH, "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n", nInputs - 1,
             Ticks<MillisecondsDouble>(time_4 - time_2),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_4 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_verify),
             Ticks<MillisecondsDouble>(m_chainman.time_verify) / m_chainman.num_blocks_total);

    if (fJustCheck)
        return true;

    if (!m_blockman.WriteUndoDataForBlock(blockundo, state, *pindex)) {
        return false;
    }

    const auto time_5{SteadyClock::now()};
    m_chainman.time_undo += time_5 - time_4;
    LogDebug(BCLog::BENCH, "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_undo),
             Ticks<MillisecondsDouble>(m_chainman.time_undo) / m_chainman.num_blocks_total);

    if (!pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
        pindex->RaiseValidity(BLOCK_VALID_SCRIPTS);
        m_blockman.m_dirty_blockindex.insert(pindex);
    }

    // add this block to the view's block chain
    view.SetBestBlock(pindex->GetBlockHash());

    const auto time_6{SteadyClock::now()};
    m_chainman.time_index += time_6 - time_5;
    LogDebug(BCLog::BENCH, "    - Index writing: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_index),
             Ticks<MillisecondsDouble>(m_chainman.time_index) / m_chainman.num_blocks_total);

    TRACE6(validation, block_connected,
        block_hash.data(),
        pindex->nHeight,
        block.vtx.size(),
        nInputs,
        nSigOpsCost,
        time_5 - time_start // in microseconds (µs)
    );

    return true;
}